

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.h
# Opt level: O0

void __thiscall
soplex::SPxMainSM<double>::DuplicateRowsPS::DuplicateRowsPS
          (DuplicateRowsPS *this,DuplicateRowsPS *old)

{
  undefined8 uVar1;
  long in_RSI;
  DataArray<bool> *in_RDI;
  PostStep *in_stack_ffffffffffffffb8;
  PostStep *in_stack_ffffffffffffffc0;
  DataArray<bool> *old_00;
  
  PostStep::PostStep(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  *(undefined ***)in_RDI = &PTR__DuplicateRowsPS_004ed2c0;
  *(undefined4 *)&in_RDI[1].memFactor = *(undefined4 *)(in_RSI + 0x28);
  uVar1 = *(undefined8 *)(in_RSI + 0x30);
  in_RDI[2].thesize = (int)uVar1;
  in_RDI[2].themax = (int)((ulong)uVar1 >> 0x20);
  *(undefined4 *)&in_RDI[2].data = *(undefined4 *)(in_RSI + 0x38);
  *(undefined4 *)((long)&in_RDI[2].data + 4) = *(undefined4 *)(in_RSI + 0x3c);
  *(byte *)&in_RDI[2].memFactor = *(byte *)(in_RSI + 0x40) & 1;
  *(byte *)((long)&in_RDI[2].memFactor + 1) = *(byte *)(in_RSI + 0x41) & 1;
  *(byte *)((long)&in_RDI[2].memFactor + 2) = *(byte *)(in_RSI + 0x42) & 1;
  *(byte *)((long)&in_RDI[2].memFactor + 3) = *(byte *)(in_RSI + 0x43) & 1;
  *(undefined4 *)((long)&in_RDI[2].memFactor + 4) = *(undefined4 *)(in_RSI + 0x44);
  DSVectorBase<double>::DSVectorBase
            ((DSVectorBase<double> *)in_stack_ffffffffffffffc0,
             (DSVectorBase<double> *)in_stack_ffffffffffffffb8);
  old_00 = (DataArray<bool> *)&in_RDI[4].data;
  DSVectorBase<double>::DSVectorBase
            ((DSVectorBase<double> *)in_stack_ffffffffffffffc0,
             (DSVectorBase<double> *)in_stack_ffffffffffffffb8);
  DataArray<int>::DataArray((DataArray<int> *)in_RDI,(DataArray<int> *)old_00);
  DataArray<int>::DataArray((DataArray<int> *)in_RDI,(DataArray<int> *)old_00);
  DataArray<bool>::DataArray(in_RDI,old_00);
  return;
}

Assistant:

DuplicateRowsPS(const DuplicateRowsPS& old)
         : PostStep(old)
         , m_i(old.m_i)
         , m_i_rowObj(old.m_i_rowObj)
         , m_maxLhsIdx(old.m_maxLhsIdx)
         , m_minRhsIdx(old.m_minRhsIdx)
         , m_maxSense(old.m_maxSense)
         , m_isFirst(old.m_isFirst)
         , m_isLast(old.m_isLast)
         , m_fixed(old.m_fixed)
         , m_nCols(old.m_nCols)
         , m_scale(old.m_scale)
         , m_rowObj(old.m_rowObj)
         , m_rIdxLocalOld(old.m_rIdxLocalOld)
         , m_perm(old.m_perm)
         , m_isLhsEqualRhs(old.m_isLhsEqualRhs)
      {}